

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O2

bool __thiscall
deqp::gls::UniformBlockCase::checkIndexQueries
          (UniformBlockCase *this,deUint32 program,UniformLayout *layout)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  pointer pBVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  deUint32 err;
  undefined4 extraout_var;
  long lVar6;
  ulong uVar7;
  undefined1 local_1b0 [384];
  
  pTVar1 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  bVar3 = true;
  this_00 = (ostringstream *)(local_1b0 + 8);
  lVar6 = 0;
  for (uVar7 = 0;
      pBVar2 = (layout->blocks).
               super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start,
      (long)uVar7 <
      (long)(int)((ulong)((long)(layout->blocks).
                                super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar2) >> 6);
      uVar7 = uVar7 + 1) {
    uVar5 = (**(code **)(CONCAT44(extraout_var,iVar4) + 0xb38))
                      (program,*(undefined8 *)((long)&(pBVar2->name)._M_dataplus._M_p + lVar6));
    if (uVar7 != uVar5) {
      local_1b0._0_8_ = pTVar1;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"ERROR: glGetUniformBlockIndex(");
      std::operator<<((ostream *)this_00,(string *)((long)&(pBVar2->name)._M_dataplus._M_p + lVar6))
      ;
      std::operator<<((ostream *)this_00,") returned ");
      std::ostream::operator<<(this_00,uVar5);
      std::operator<<((ostream *)this_00,", expected ");
      std::ostream::operator<<(this_00,(int)uVar7);
      std::operator<<((ostream *)this_00,"!");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      bVar3 = false;
    }
    err = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
    glu::checkError(err,"glGetUniformBlockIndex()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                    ,0x75d);
    lVar6 = lVar6 + 0x40;
  }
  return bVar3;
}

Assistant:

bool UniformBlockCase::checkIndexQueries (deUint32 program, const UniformLayout& layout) const
{
	tcu::TestLog&				log			= m_testCtx.getLog();
	const glw::Functions&		gl			= m_renderCtx.getFunctions();
	bool						allOk		= true;

	// \note Spec mandates that uniform blocks are assigned consecutive locations from 0
	//		 to ACTIVE_UNIFORM_BLOCKS. BlockLayoutEntries are stored in that order in UniformLayout.
	for (int blockNdx = 0; blockNdx < (int)layout.blocks.size(); blockNdx++)
	{
		const BlockLayoutEntry&		block		= layout.blocks[blockNdx];
		const int					queriedNdx	= gl.getUniformBlockIndex(program, block.name.c_str());

		if (queriedNdx != blockNdx)
		{
			log << TestLog::Message << "ERROR: glGetUniformBlockIndex(" << block.name << ") returned " << queriedNdx << ", expected " << blockNdx << "!" << TestLog::EndMessage;
			allOk = false;
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformBlockIndex()");
	}

	return allOk;
}